

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::RegisterGenome(Model *this,Ptr *genome)

{
  element_type *peVar1;
  SpeciesTracker *inst;
  shared_ptr<Polymer> local_28;
  Ptr *local_18;
  Ptr *genome_local;
  Model *this_local;
  
  local_18 = genome;
  genome_local = (Ptr *)this;
  std::shared_ptr<Polymer>::shared_ptr<Genome,void>(&local_28,genome);
  RegisterPolymer(this,&local_28);
  std::shared_ptr<Polymer>::~shared_ptr(&local_28);
  peVar1 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      genome);
  inst = SpeciesTracker::Instance();
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::ConnectMember<SpeciesTracker>(&(peVar1->super_Polymer).termination_signal_,inst,0x142cd0);
  peVar1 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      genome);
  Signal<std::shared_ptr<Transcript>_>::ConnectMember<Model>
            (&peVar1->transcript_signal_,this,0x14e670);
  std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>::push_back
            (&this->genomes_,genome);
  return;
}

Assistant:

void Model::RegisterGenome(Genome::Ptr genome) {
  RegisterPolymer(genome);
  genome->termination_signal_.ConnectMember(
      &SpeciesTracker::Instance(), &SpeciesTracker::TerminateTranscription);
  genome->transcript_signal_.ConnectMember(this, &Model::RegisterTranscript);
  genomes_.push_back(genome);
}